

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

void Jf_ManGenCnf(word uTruth,int iLitOut,Vec_Int_t *vLeaves,Vec_Int_t *vLits,Vec_Int_t *vClas,
                 Vec_Int_t *vCover)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int RetValue;
  int Cube;
  int Literal;
  int c;
  int k;
  int i;
  Vec_Int_t *vCover_local;
  Vec_Int_t *vClas_local;
  Vec_Int_t *vLits_local;
  Vec_Int_t *vLeaves_local;
  word wStack_10;
  int iLitOut_local;
  word uTruth_local;
  
  wStack_10 = uTruth;
  if ((uTruth == 0) || (uTruth == 0xffffffffffffffff)) {
    iVar1 = Vec_IntSize(vLits);
    Vec_IntPush(vClas,iVar1);
    iVar1 = Abc_LitNotCond(iLitOut,(uint)(wStack_10 == 0));
    Vec_IntPush(vLits,iVar1);
  }
  else {
    iVar1 = Vec_IntSize(vLeaves);
    if (iVar1 < 1) {
      __assert_fail("Vec_IntSize(vLeaves) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                    ,0x8a,
                    "void Jf_ManGenCnf(word, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (Cube = 0; Cube < 2; Cube = Cube + 1) {
      iVar1 = Vec_IntSize(vLeaves);
      iVar1 = Kit_TruthIsop((uint *)&stack0xfffffffffffffff0,iVar1,vCover,0);
      if (iVar1 != 0) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                      ,0x8e,
                      "void Jf_ManGenCnf(word, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      for (c = 0; iVar1 = Vec_IntSize(vCover), c < iVar1; c = c + 1) {
        iVar1 = Vec_IntEntry(vCover,c);
        iVar2 = Vec_IntSize(vLits);
        Vec_IntPush(vClas,iVar2);
        iVar2 = Abc_LitNotCond(iLitOut,Cube);
        Vec_IntPush(vLits,iVar2);
        for (Literal = 0; iVar2 = Vec_IntSize(vLeaves), Literal < iVar2; Literal = Literal + 1) {
          uVar3 = iVar1 >> ((byte)(Literal << 1) & 0x1f) & 3;
          if (uVar3 == 1) {
            iVar2 = Vec_IntEntry(vLeaves,Literal);
            iVar2 = Abc_LitNotCond(iVar2,0);
            Vec_IntPush(vLits,iVar2);
          }
          else if (uVar3 == 2) {
            iVar2 = Vec_IntEntry(vLeaves,Literal);
            iVar2 = Abc_LitNotCond(iVar2,1);
            Vec_IntPush(vLits,iVar2);
          }
          else if (uVar3 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                          ,0x9b,
                          "void Jf_ManGenCnf(word, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
        }
      }
      wStack_10 = wStack_10 ^ 0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

void Jf_ManGenCnf( word uTruth, int iLitOut, Vec_Int_t * vLeaves, Vec_Int_t * vLits, Vec_Int_t * vClas, Vec_Int_t * vCover )
{
    if ( uTruth == 0 || ~uTruth == 0 )
    {
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        Vec_IntPush( vLits, Abc_LitNotCond(iLitOut, (uTruth == 0)) );
    }
    else 
    {
        int i, k, c, Literal, Cube;
        assert( Vec_IntSize(vLeaves) > 0 );
        for ( c = 0; c < 2; c ++ )
        {
            int RetValue = Kit_TruthIsop( (unsigned *)&uTruth, Vec_IntSize(vLeaves), vCover, 0 );
            assert( RetValue == 0 );
            Vec_IntForEachEntry( vCover, Cube, i )
            {
                Vec_IntPush( vClas, Vec_IntSize(vLits) );
                Vec_IntPush( vLits, Abc_LitNotCond(iLitOut, c) );
                for ( k = 0; k < Vec_IntSize(vLeaves); k++ )
                {
                    Literal = 3 & (Cube >> (k << 1));
                    if ( Literal == 1 )      // '0'  -> pos lit
                        Vec_IntPush( vLits, Abc_LitNotCond(Vec_IntEntry(vLeaves, k), 0) );
                    else if ( Literal == 2 ) // '1'  -> neg lit
                        Vec_IntPush( vLits, Abc_LitNotCond(Vec_IntEntry(vLeaves, k), 1) );
                    else if ( Literal != 0 )
                        assert( 0 );
                }
            }
            uTruth = ~uTruth;
        }
    }
}